

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

bool __thiscall Board::isSolveable(Board *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  TileValue TVar4;
  pointer pTVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  
  pTVar5 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = (long)(this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar5;
  if (lVar14 != 0) {
    uVar2 = this->SIZE;
    uVar3 = this->SQUARE_SIZE;
    uVar17 = (ulong)uVar2;
    uVar15 = (ulong)(uVar2 + (uVar2 == 0));
    uVar9 = 0;
    do {
      uVar8 = (uint)uVar9;
      if (pTVar5[uVar9].status != Empty) {
        TVar4 = pTVar5[uVar9].value;
        uVar6 = uVar9 / uVar17;
        uVar9 = uVar9 % uVar17;
        iVar18 = 0;
        bVar19 = false;
        uVar13 = 1;
        do {
          if ((uVar13 - uVar9 != 1) && (pTVar5[(uVar8 - (int)uVar9) + iVar18].value == TVar4))
          break;
          iVar18 = iVar18 + 1;
          bVar19 = uVar17 <= uVar13;
          bVar20 = uVar13 != uVar15;
          uVar13 = uVar13 + 1;
        } while (bVar20);
        if (!bVar19) {
          return false;
        }
        iVar18 = 0;
        bVar19 = false;
        uVar13 = 1;
        do {
          if ((uVar13 - uVar6 != 1) && (pTVar5[iVar18 * uVar2 + (int)uVar9].value == TVar4)) break;
          iVar18 = iVar18 + 1;
          bVar19 = uVar17 <= uVar13;
          bVar20 = uVar13 != uVar15;
          uVar13 = uVar13 + 1;
        } while (bVar20);
        if (!bVar19) {
          return false;
        }
        uVar11 = ((int)(uVar9 / uVar3) + (int)uVar6) - (int)(uVar6 % (ulong)uVar3);
        uVar7 = uVar11 / uVar3;
        uVar11 = uVar11 % uVar3;
        uVar10 = uVar7 * uVar3;
        uVar7 = (uVar7 + 1) * uVar3 - 1;
        if (uVar10 <= uVar7) {
          uVar12 = uVar11 * uVar3;
          uVar11 = (uVar11 + 1) * uVar3 - 1;
          do {
            if (uVar12 <= uVar11) {
              uVar16 = uVar12;
              do {
                uVar1 = uVar16 + uVar10 * uVar2;
                if ((uVar1 != uVar8) && (pTVar5[uVar1].value == TVar4)) {
                  return false;
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 <= uVar11);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 <= uVar7);
        }
      }
      uVar9 = (ulong)(uVar8 + 1);
    } while (uVar9 < (ulong)(lVar14 >> 3));
  }
  return true;
}

Assistant:

const bool Board::isSolveable() const
{
	for (unsigned int i = 0; i < _tiles.size(); i++)
	{
		if (_tiles[i].status != TileStatus::Empty && !isTileInsertionValid(i))
			return false;
	}

	return true;
}